

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O0

bool __thiscall CDBWrapper::Exists<unsigned_char>(CDBWrapper *this,uchar *key)

{
  byte bVar1;
  DataStream *in_RDI;
  long in_FS_OFFSET;
  undefined1 in_stack_00000040 [16];
  DataStream ssKey;
  DataStream *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  CDBWrapper *this_00;
  
  this_00 = *(CDBWrapper **)(in_FS_OFFSET + 0x28);
  DataStream::DataStream(in_stack_ffffffffffffff88);
  DataStream::reserve(in_stack_ffffffffffffff88,0x37fb15);
  DataStream::operator<<
            (in_RDI,(uchar *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  Span<const_std::byte>::Span<DataStream>
            ((Span<const_std::byte> *)in_RDI,
             (DataStream *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88);
  bVar1 = ExistsImpl(this_00,(Span<const_std::byte>)in_stack_00000040);
  DataStream::~DataStream(in_stack_ffffffffffffff88);
  if (*(CDBWrapper **)(in_FS_OFFSET + 0x28) == this_00) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool Exists(const K& key) const
    {
        DataStream ssKey{};
        ssKey.reserve(DBWRAPPER_PREALLOC_KEY_SIZE);
        ssKey << key;
        return ExistsImpl(ssKey);
    }